

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O0

void __thiscall
baryonyx::itm::quadratic_cost_type<double>::make_loo_norm(quadratic_cost_type<double> *this,int n)

{
  int iVar1;
  double dVar2;
  bool bVar3;
  pointer __first;
  pointer pdVar4;
  double *pdVar5;
  type piVar6;
  type pqVar7;
  type pdVar8;
  int local_30;
  int e_1;
  int i_2;
  int i_1;
  int e;
  int i;
  double div;
  quadratic_cost_type<double> *pqStack_10;
  int n_local;
  quadratic_cost_type<double> *this_local;
  
  div._4_4_ = n;
  pqStack_10 = this;
  __first = std::unique_ptr<double[],_std::default_delete<double[]>_>::get(&this->linear_elements);
  pdVar4 = std::unique_ptr<double[],_std::default_delete<double[]>_>::get(&this->linear_elements);
  pdVar5 = std::max_element<double*>(__first,pdVar4 + div._4_4_);
  _e = *pdVar5;
  i_1 = 0;
  piVar6 = std::unique_ptr<int[],_std::default_delete<int[]>_>::operator[]
                     (&this->indices,(long)div._4_4_);
  iVar1 = *piVar6;
  for (; i_1 != iVar1; i_1 = i_1 + 1) {
    pqVar7 = std::
             unique_ptr<baryonyx::itm::quadratic_cost_type<double>::quad[],_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
             ::operator[](&this->quadratic_elements,(long)i_1);
    pdVar5 = std::max<double>(&pqVar7->factor,(double *)&e);
    _e = *pdVar5;
  }
  bVar3 = std::isnormal(_e);
  if (bVar3) {
    for (e_1 = 0; dVar2 = _e, e_1 != div._4_4_; e_1 = e_1 + 1) {
      pdVar8 = std::unique_ptr<double[],_std::default_delete<double[]>_>::operator[]
                         (&this->linear_elements,(long)e_1);
      *pdVar8 = *pdVar8 / dVar2;
    }
    local_30 = 0;
    piVar6 = std::unique_ptr<int[],_std::default_delete<int[]>_>::operator[]
                       (&this->indices,(long)div._4_4_);
    iVar1 = *piVar6;
    for (; dVar2 = _e, local_30 != iVar1; local_30 = local_30 + 1) {
      pqVar7 = std::
               unique_ptr<baryonyx::itm::quadratic_cost_type<double>::quad[],_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
               ::operator[](&this->quadratic_elements,(long)local_30);
      pqVar7->factor = pqVar7->factor / dVar2;
    }
  }
  return;
}

Assistant:

void make_loo_norm(int n)
    {
        Float div =
          *std::max_element(linear_elements.get(), linear_elements.get() + n);

        for (int i = 0, e = indices[n]; i != e; ++i)
            div = std::max(quadratic_elements[i].factor, div);

        if (std::isnormal(div)) {
            for (int i = 0; i != n; ++i)
                linear_elements[i] /= div;

            for (int i = 0, e = indices[n]; i != e; ++i)
                quadratic_elements[i].factor /= div;
        }
    }